

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O1

void __thiscall
TPZSFMatrix<long_double>::TPZSFMatrix(TPZSFMatrix<long_double> *this,TPZSFMatrix<long_double> *A)

{
  longdouble lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar4;
  longdouble *plVar5;
  int extraout_var_02;
  longdouble *plVar6;
  longdouble *plVar7;
  long lVar3;
  
  iVar2 = (*(A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(A);
  lVar3 = CONCAT44(extraout_var,iVar2);
  iVar2 = (*(A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(A);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = lVar3;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = CONCAT44(extraout_var_00,iVar2);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSFMatrix_01890760;
  if (lVar3 != CONCAT44(extraout_var_00,iVar2)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot call TPZBaseMatrix::Dim() for a non-square ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"matrix! Aborting...",0x13);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzbasematrix.h"
               ,0x4f);
  }
  iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  uVar4 = (CONCAT44(extraout_var_01,iVar2) + 1) * lVar3 >> 1;
  plVar5 = (longdouble *)operator_new__(-(ulong)(uVar4 >> 0x3c != 0) | uVar4 << 4);
  this->fElem = plVar5;
  plVar7 = A->fElem;
  iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x4b])(this);
  if (CONCAT44(extraout_var_02,iVar2) != 0 && -1 < extraout_var_02) {
    plVar6 = plVar5 + CONCAT44(extraout_var_02,iVar2);
    do {
      lVar1 = *plVar7;
      plVar7 = plVar7 + 1;
      *plVar5 = lVar1;
      plVar5 = plVar5 + 1;
    } while (plVar5 < plVar6);
  }
  return;
}

Assistant:

TPZSFMatrix<TVar> ::TPZSFMatrix (const TPZSFMatrix<TVar>  & A)
: TPZRegisterClassId(&TPZSFMatrix::ClassId),
TPZMatrix<TVar> ( A.Dim(), A.Dim() )
{
    int64_t size = Size();
	fElem = new TVar[size] ;
	if ( fElem == NULL )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Constructor <memory allocation error>." );
	
	// Copia a matriz
	TVar *src = A.fElem;
	TVar *dst = fElem;
	TVar *end = &fElem[Size()];
	while ( dst < end )
		*dst++ = *src++;
}